

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::getEDPrivateKey(SoftHSM *this,EDPrivateKey *privateKey,Token *token,OSObject *key)

{
  int iVar1;
  undefined1 uVar2;
  undefined7 uVar3;
  uchar *in_R8;
  size_t in_R9;
  CK_RV CVar4;
  ByteString value;
  ByteString group;
  ByteString local_a8;
  ByteString local_80;
  ByteString local_58;
  
  uVar3 = (undefined7)((ulong)key >> 8);
  uVar2 = token == (Token *)0x0 || privateKey == (EDPrivateKey *)0x0;
  if (key == (OSObject *)0x0 || (bool)uVar2) {
    return 7;
  }
  iVar1 = (*key->_vptr_OSObject[4])(key,2,0);
  ByteString::ByteString(&local_58);
  ByteString::ByteString(&local_80);
  if ((char)iVar1 == '\0') {
    (*key->_vptr_OSObject[6])(&local_a8,key,0x180);
    ByteString::operator=(&local_58,&local_a8);
    local_a8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_a8.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    (*key->_vptr_OSObject[6])(&local_a8,key,0x11);
    ByteString::operator=(&local_80,&local_a8);
    local_a8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_a8.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  else {
    (*key->_vptr_OSObject[6])(&local_a8,key,0x180);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_a8,(uchar *)&local_58,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    local_a8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_a8.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    CVar4 = 5;
    if ((char)iVar1 == '\0') goto LAB_001352ac;
    (*key->_vptr_OSObject[6])(&local_a8,key,0x11);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_a8,(uchar *)&local_80,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    local_a8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_a8.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    if ((char)iVar1 == '\0') goto LAB_001352ac;
  }
  (**(code **)(*(long *)privateKey + 0x50))(privateKey,&local_58);
  (**(code **)(*(long *)privateKey + 0x48))(privateKey,&local_80);
  CVar4 = 0;
LAB_001352ac:
  local_80._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_80.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_58.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return CVar4;
}

Assistant:

CK_RV SoftHSM::getEDPrivateKey(EDPrivateKey* privateKey, Token* token, OSObject* key)
{
	if (privateKey == NULL) return CKR_ARGUMENTS_BAD;
	if (token == NULL) return CKR_ARGUMENTS_BAD;
	if (key == NULL) return CKR_ARGUMENTS_BAD;

	// Get the CKA_PRIVATE attribute, when the attribute is not present use default false
	bool isKeyPrivate = key->getBooleanValue(CKA_PRIVATE, false);

	// EDDSA Private Key Attributes
	ByteString group;
	ByteString value;
	if (isKeyPrivate)
	{
		bool bOK = true;
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_EC_PARAMS), group);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_VALUE), value);
		if (!bOK)
			return CKR_GENERAL_ERROR;
	}
	else
	{
		group = key->getByteStringValue(CKA_EC_PARAMS);
		value = key->getByteStringValue(CKA_VALUE);
	}

	privateKey->setEC(group);
	privateKey->setK(value);

	return CKR_OK;
}